

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  int local_58;
  int local_54;
  int y1;
  int x1;
  int y0;
  int x0;
  int *iy1_local;
  int *ix1_local;
  int *iy0_local;
  int *ix0_local;
  float local_20;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int glyph_local;
  stbtt_fontinfo *font_local;
  
  x1 = 0;
  y1 = 0;
  _y0 = iy1;
  iy1_local = ix1;
  ix1_local = iy0;
  iy0_local = ix0;
  ix0_local._4_4_ = shift_y;
  local_20 = shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  scale_y_local = (float)glyph;
  _scale_x_local = font;
  iVar1 = stbtt_GetGlyphBox(font,glyph,&x1,&y1,&local_54,&local_58);
  if (iVar1 == 0) {
    if (iy0_local != (int *)0x0) {
      *iy0_local = 0;
    }
    if (ix1_local != (int *)0x0) {
      *ix1_local = 0;
    }
    if (iy1_local != (int *)0x0) {
      *iy1_local = 0;
    }
    if (_y0 != (int *)0x0) {
      *_y0 = 0;
    }
  }
  else {
    dVar2 = extraout_XMM0_Qa;
    if (iy0_local != (int *)0x0) {
      dVar2 = std::floor((double)CONCAT44((int)((ulong)extraout_XMM0_Qa >> 0x20),
                                          (float)x1 * shift_x_local + local_20));
      *iy0_local = (int)SUB84(dVar2,0);
    }
    if (ix1_local != (int *)0x0) {
      dVar2 = std::floor((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                          (float)-local_58 * shift_y_local + ix0_local._4_4_));
      *ix1_local = (int)SUB84(dVar2,0);
    }
    if (iy1_local != (int *)0x0) {
      dVar2 = std::ceil((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                         (float)local_54 * shift_x_local + local_20));
      *iy1_local = (int)SUB84(dVar2,0);
    }
    if (_y0 != (int *)0x0) {
      dVar2 = std::ceil((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                         (float)-y1 * shift_y_local + ix0_local._4_4_));
      *_y0 = (int)SUB84(dVar2,0);
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}